

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  _Base_ptr p_Var8;
  const_iterator cVar9;
  ostream *poVar10;
  undefined8 uVar11;
  size_type *psVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong *puVar15;
  int iVar16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string command_str;
  string help_string;
  key_type local_100;
  key_type local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ulong local_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  char **local_38;
  
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Usage: ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar18) {
    local_e0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_e0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_e0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_e0._M_string_length = plVar5[1];
  *plVar5 = (long)paVar18;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  psVar12 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_100.field_2._M_allocated_capacity = *psVar12;
    local_100.field_2._8_8_ = plVar5[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar12;
    local_100._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_100._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_58 = &local_48;
  plVar13 = plVar5 + 2;
  if ((long *)*plVar5 == plVar13) {
    local_48 = *plVar13;
    lStack_40 = plVar5[3];
  }
  else {
    local_48 = *plVar13;
    local_58 = (long *)*plVar5;
  }
  local_50 = plVar5[1];
  *plVar5 = (long)plVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_38 = argv;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_60 = (ulong)(uint)argc;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  p_Var8 = commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    iVar3 = 0;
    p_Var6 = commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      iVar16 = *(int *)&p_Var6[1]._M_parent;
      if (*(int *)&p_Var6[1]._M_parent < iVar3) {
        iVar16 = iVar3;
      }
      iVar3 = iVar16;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != &commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
    if ((_Rb_tree_header *)p_Var8 != &commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      do {
        p_Var6 = p_Var8[1]._M_parent;
        std::operator+(&local_a0,"    ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
        local_80 = local_70;
        std::__cxx11::string::_M_construct((ulong)&local_80,((char)iVar3 + '\x03') - (char)p_Var6);
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          uVar11 = local_a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_78 + local_a0._M_string_length) {
          uVar17 = 0xf;
          if (local_80 != local_70) {
            uVar17 = local_70[0];
          }
          if (uVar17 < local_78 + local_a0._M_string_length) goto LAB_0010c665;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_80,0,(char *)0x0,(ulong)local_a0._M_dataplus._M_p);
        }
        else {
LAB_0010c665:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
        }
        local_c0 = &local_b0;
        plVar5 = puVar7 + 2;
        if ((long *)*puVar7 == plVar5) {
          local_b0 = *plVar5;
          lStack_a8 = puVar7[3];
        }
        else {
          local_b0 = *plVar5;
          local_c0 = (long *)*puVar7;
        }
        local_b8 = puVar7[1];
        *puVar7 = plVar5;
        puVar7[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,*(ulong *)(p_Var8 + 2));
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar18) {
          local_e0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_e0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_e0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_e0._M_string_length = plVar5[1];
        *plVar5 = (long)paVar18;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
        psVar12 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_100.field_2._M_allocated_capacity = *psVar12;
          local_100.field_2._8_8_ = plVar5[3];
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar12;
          local_100._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_100._M_string_length = plVar5[1];
        *plVar5 = (long)psVar12;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_80 != local_70) {
          operator_delete(local_80,local_70[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
      ;
    }
  }
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"\n","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
  ppcVar2 = local_38;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_a0.field_2._M_allocated_capacity = *psVar12;
    local_a0.field_2._8_8_ = plVar5[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar12;
    local_a0._M_dataplus._M_p = (pointer)*plVar5;
  }
  paVar18 = &local_100.field_2;
  local_a0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar13 = plVar5 + 2;
  if ((long *)*plVar5 == plVar13) {
    local_b0 = *plVar13;
    lStack_a8 = plVar5[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar13;
    local_c0 = (long *)*plVar5;
  }
  local_b8 = plVar5[1];
  *plVar5 = (long)plVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar14) {
    local_e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_e0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_e0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_e0._M_string_length = plVar5[1];
  *plVar5 = (long)paVar14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  puVar15 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_100.field_2._M_allocated_capacity = *puVar15;
    local_100.field_2._8_8_ = plVar5[3];
    local_100._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_100.field_2._M_allocated_capacity = *puVar15;
    local_100._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_100._M_string_length = plVar5[1];
  *plVar5 = (long)puVar15;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_100._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar18) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  local_100._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"ls","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
          ::find(&commands_abi_cxx11_._M_t,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar18) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  iVar3 = (int)local_60;
  iVar16 = iVar3 + -1;
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ppcVar2 + 1);
  if (1 < iVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,(char *)paVar18->_M_allocated_capacity,
               (allocator<char> *)&local_e0);
    iVar3 = std::__cxx11::string::compare((char *)&local_100);
    if (iVar3 == 0) {
LAB_0010cb71:
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_58,local_50);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
LAB_0010cba4:
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      bVar1 = false;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_100);
      if (iVar3 == 0) goto LAB_0010cb71;
      iVar3 = std::__cxx11::string::compare((char *)&local_100);
      if (iVar3 == 0) {
        poVar10 = (ostream *)&std::cout;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2.0.1",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        goto LAB_0010cba4;
      }
      bVar1 = true;
      if ((local_100._M_string_length != 0) && (*local_100._M_dataplus._M_p != '-')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,(char *)paVar18->_M_allocated_capacity,
                   (allocator<char> *)&local_c0);
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command>_>_>
                ::find(&commands_abi_cxx11_._M_t,&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        iVar16 = (int)local_60 + -2;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ppcVar2 + 2);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    iVar4 = 0;
    iVar3 = (int)local_60;
    if (!bVar1) goto LAB_0010ccea;
  }
  if ((_Rb_tree_header *)cVar9._M_node == &commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid command\n",0x10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_58,local_50);
    local_100._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_100,1);
    iVar4 = 1;
  }
  else {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_allocated_capacity =
         local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (iVar3 - iVar16 != 0 && iVar16 <= iVar3) {
      uVar17 = 0;
      do {
        if (local_100._M_string_length != 0) {
          std::__cxx11::string::push_back('\0');
        }
        std::__cxx11::string::append((char *)&local_100);
        uVar17 = uVar17 + 1;
      } while ((uint)(iVar3 - iVar16) != uVar17);
    }
    local_c0 = (long *)CONCAT44(local_c0._4_4_,iVar16);
    local_e0._M_dataplus._M_p = (pointer)paVar18;
    if (cVar9._M_node[3]._M_left == (_Base_ptr)0x0) {
      uVar11 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      _Unwind_Resume(uVar11);
    }
    iVar4 = (*(code *)cVar9._M_node[3]._M_right)(cVar9._M_node + 3,&local_100,&local_c0,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0010ccea:
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
  WSA wsa;

  std::string help_string = std::string("Usage: ") +
      argv[0] + " [-h | --help] [--version] <command> [<args>]\n\n" +
      "Available commands are:\n";

  const int max_command_len = getMaxCommandLen(commands);
  for (const auto &cmd : commands)
  {
    const int min_padding = 3;
    const int padding =
        max_command_len + min_padding - static_cast<int>(cmd.first.length());
    help_string += "    " + cmd.first +
                   std::string(static_cast<std::size_t>(padding), ' ') +
                   cmd.second.description + "\n";
  }

  help_string += std::string("\n") +
      "If no command is given, 'ls' is assumed.\n" +
      "See '" + argv[0] + " <command> --help' for command-specific help.";

  auto command = commands.find("ls");

  int argc_subcommand = argc - 1;
  char **argv_subcommand = argv + 1;

  if (argc > 1)
  {
    const std::string argv_1(argv[1]);
    if (argv_1 == "--help" || argv_1 == "-h")
    {
      std::cout << help_string << std::endl;
      return 0;
    }
    if (argv_1 == "--version")
    {
      std::cout << PACKAGE_VERSION << std::endl;
      return 0;
    }

    if (!argv_1.empty() && argv_1[0] != '-')
    {
      command = commands.find(argv[1]);
      --argc_subcommand;
      ++argv_subcommand;
    }
  }

  if (command == commands.end())
  {
    std::cerr << "Invalid command\n";
    std::cerr << help_string << '\n';
    return 1;
  }

  std::string command_str;
  for (int i = 0; i < (argc - argc_subcommand); ++i)
  {
    if (!command_str.empty())
    { command_str += ' '; }
    command_str += argv[i];
  }

  return command->second.fun(command_str, argc_subcommand, argv_subcommand);
}